

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall kratos::ForStmt::set_parent(ForStmt *this,IRNode *node)

{
  bool bVar1;
  IRNodeKind IVar2;
  StmtBlock *pSVar3;
  element_type *peVar4;
  UserException *this_00;
  Generator *pGVar5;
  __shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar6;
  shared_ptr<kratos::Stmt> *st;
  iterator __end1;
  iterator __begin1;
  element_type *__range1;
  Generator *gen;
  Stmt *stmt;
  Generator *gen_1;
  allocator<char> local_59;
  string local_58;
  undefined1 local_32;
  bool is_genvar;
  iterator iStack_30;
  shared_ptr<kratos::Stmt> *local_28;
  byte local_19;
  Generator *pGStack_18;
  bool all_instantiation;
  IRNode *node_local;
  ForStmt *this_local;
  
  pGStack_18 = (Generator *)node;
  node_local = (IRNode *)this;
  IVar2 = IRNode::ir_node_kind(node);
  if (IVar2 == StmtKind) {
    pGVar5 = Stmt::generator_parent((Stmt *)pGStack_18);
    if (pGVar5 != (Generator *)0x0) {
      peVar4 = std::__shared_ptr_access<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->iter_);
      Var::set_generator(&peVar4->super_Var,pGVar5);
    }
    Stmt::set_parent(&this->super_Stmt,&pGStack_18->super_IRNode);
    pSVar3 = &std::
              __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->loop_body_)->super_StmtBlock;
    __end1 = StmtBlock::begin(pSVar3);
    st = (shared_ptr<kratos::Stmt> *)StmtBlock::end(pSVar3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                                       *)&st), bVar1) {
      this_01 = (__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                ::operator*(&__end1);
      peVar6 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_01);
      (*(peVar6->super_IRNode)._vptr_IRNode[7])(peVar6,this);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
      ::operator++(&__end1);
    }
  }
  else {
    pSVar3 = &std::
              __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->loop_body_)->super_StmtBlock;
    local_28 = (shared_ptr<kratos::Stmt> *)StmtBlock::begin(pSVar3);
    pSVar3 = &std::
              __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->loop_body_)->super_StmtBlock;
    iStack_30 = StmtBlock::end(pSVar3);
    local_19 = std::
               all_of<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Stmt>*,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>>,kratos::ForStmt::set_parent(kratos::IRNode*)::__0>
                         (local_28,iStack_30._M_current);
    peVar4 = std::__shared_ptr_access<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->iter_);
    local_32 = IterVar::is_gen_var(peVar4);
    if (((!(bool)local_32) || ((local_19 & 1) == 0)) ||
       (IVar2 = IRNode::ir_node_kind(&pGStack_18->super_IRNode), pGVar5 = pGStack_18,
       IVar2 != GeneratorKind)) {
      this_00 = (UserException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"For loop can only be added to statement body",&local_59);
      UserException::UserException(this_00,&local_58);
      __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
    }
    peVar4 = std::__shared_ptr_access<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->iter_);
    Var::set_generator(&peVar4->super_Var,pGVar5);
    Stmt::set_parent(&this->super_Stmt,&pGStack_18->super_IRNode);
  }
  return;
}

Assistant:

void ForStmt::set_parent(IRNode *node) {
    if (node->ir_node_kind() != IRNodeKind::StmtKind) {
        // make sure it is genvar and all it's statements is instantiation statement
        bool all_instantiation = std::all_of(
            loop_body_->begin(), loop_body_->end(), [](const std::shared_ptr<Stmt> &stmt) {
                return stmt->type() == StatementType::ModuleInstantiation;
            });
        // make sure it's genvar marked
        bool is_genvar = iter_->is_gen_var();
        if (!is_genvar || !all_instantiation || node->ir_node_kind() != IRNodeKind::GeneratorKind) {
            throw UserException("For loop can only be added to statement body");
        } else {
            auto *gen = reinterpret_cast<Generator *>(node);
            iter_->set_generator(gen);
            Stmt::set_parent(node);
            return;
        }
    }
    auto *stmt = reinterpret_cast<Stmt *>(node);
    auto *gen = stmt->generator_parent();
    if (gen) {
        iter_->set_generator(gen);
    }
    Stmt::set_parent(node);
    for (auto &st : (*loop_body_)) {
        st->set_parent(this);
    }
}